

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_resetCCtx_internal
                 (ZSTD_CCtx *zc,ZSTD_CCtx_params *params,U64 pledgedSrcSize,size_t loadedDictSize,
                 ZSTD_compResetPolicy_e crp,ZSTD_buffered_policy_e zbuff)

{
  ldmParams_t *params_00;
  ZSTD_compressionParameters *cParams;
  int *piVar1;
  ZSTD_cwksp *ws;
  ZSTD_compressedBlockState_t *pZVar2;
  ZSTD_paramSwitch_e ZVar3;
  ZSTD_cwksp_alloc_phase_e ZVar4;
  ulong maxBlockSize;
  ZSTD_freeFunction p_Var5;
  ZSTD_allocFunction p_Var6;
  char *pcVar7;
  BYTE *pBVar8;
  bool bVar9;
  bool bVar10;
  ZSTD_strategy ZVar11;
  undefined4 in_EAX;
  int iVar12;
  ulong uVar13;
  size_t __size;
  void *pvVar14;
  void *pvVar15;
  ZSTD_compressedBlockState_t *pZVar16;
  U32 *pUVar17;
  long lVar18;
  size_t sVar19;
  seqDef *psVar20;
  ldmEntry_t *__s;
  rawSeq *prVar21;
  ZSTD_Sequence *pZVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  size_t buffInSize;
  size_t buffOutSize;
  ZSTD_indexResetPolicy_e forceResetIndex;
  size_t err_code;
  size_t sVar27;
  char *pcVar28;
  BYTE *pBVar29;
  size_t __n;
  bool bVar30;
  bool bVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar38;
  uint uVar39;
  undefined1 in_XMM1 [16];
  undefined1 auVar37 [16];
  uint uVar40;
  ulong local_48;
  
  uVar32 = (params->cParams).windowLog - 0x20;
  uVar33 = (params->cParams).chainLog - 0x1f;
  uVar34 = (params->cParams).hashLog - 0x1f;
  uVar35 = (params->cParams).searchLog - 0x1f;
  auVar37 = pmovsxbd(in_XMM1,0xe1e6e6e9);
  uVar36 = auVar37._0_4_;
  uVar38 = auVar37._4_4_;
  uVar39 = auVar37._8_4_;
  uVar40 = auVar37._12_4_;
  auVar37._0_4_ = -(uint)(((uVar32 < uVar36) * uVar32 | (uVar32 >= uVar36) * uVar36) == uVar32);
  auVar37._4_4_ = -(uint)(((uVar33 < uVar38) * uVar33 | (uVar33 >= uVar38) * uVar38) == uVar33);
  auVar37._8_4_ = -(uint)(((uVar34 < uVar39) * uVar34 | (uVar34 >= uVar39) * uVar39) == uVar34);
  auVar37._12_4_ = -(uint)(((uVar35 < uVar40) * uVar35 | (uVar35 >= uVar40) * uVar40) == uVar35);
  iVar12 = movmskps(in_EAX,auVar37);
  if ((((iVar12 != 0) || (4 < (params->cParams).minMatch - 3)) ||
      (0x20000 < (params->cParams).targetLength)) || (8 < (params->cParams).strategy - ZSTD_fast)) {
    __assert_fail("!ZSTD_isError(ZSTD_checkCParams(params->cParams))",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58bf,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  zc->isFirstBlock = 1;
  memcpy(&zc->appliedParams,params,0xd0);
  if ((zc->appliedParams).useRowMatchFinder == ZSTD_ps_auto) {
    __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58c9,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((zc->appliedParams).useBlockSplitter == ZSTD_ps_auto) {
    __assert_fail("params->useBlockSplitter != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58ca,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  ZVar3 = (zc->appliedParams).ldmParams.enableLdm;
  if (ZVar3 == ZSTD_ps_auto) {
    __assert_fail("params->ldmParams.enableLdm != ZSTD_ps_auto",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58cb,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  if ((zc->appliedParams).maxBlockSize == 0) {
    __assert_fail("params->maxBlockSize != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x58cc,
                  "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                 );
  }
  params_00 = &(zc->appliedParams).ldmParams;
  if (ZVar3 == ZSTD_ps_enable) {
    ZSTD_ldm_adjustParameters(params_00,&(zc->appliedParams).cParams);
    if ((zc->appliedParams).ldmParams.hashLog < (zc->appliedParams).ldmParams.bucketSizeLog) {
      __assert_fail("params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x58d0,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
    if (0x1f < (zc->appliedParams).ldmParams.hashRateLog) {
      __assert_fail("params->ldmParams.hashRateLog < 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x58d1,
                    "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                   );
    }
  }
  uVar25 = 1L << ((byte)(zc->appliedParams).cParams.windowLog & 0x3f);
  if (pledgedSrcSize <= uVar25) {
    uVar25 = pledgedSrcSize;
  }
  if (pledgedSrcSize == 0) {
    uVar25 = 1;
  }
  maxBlockSize = (zc->appliedParams).maxBlockSize;
  uVar26 = uVar25;
  if (maxBlockSize < uVar25) {
    uVar26 = maxBlockSize;
  }
  iVar12 = (zc->appliedParams).useSequenceProducer;
  uVar23 = 4 - (ulong)(iVar12 != 0 || (zc->appliedParams).cParams.minMatch == 3);
  uVar13 = uVar26 / uVar23;
  buffOutSize = 0;
  if (zbuff == ZSTDb_buffered) {
    if ((zc->appliedParams).outBufferMode == ZSTD_bm_buffered) {
      if (uVar26 < 0xff00ff00ff00ff00) {
        uVar24 = 0;
        if (uVar26 < 0x20000) {
          uVar24 = -(uVar26 - 0x20000) >> 0xb;
        }
        lVar18 = (uVar26 >> 8) + uVar26 + uVar24;
      }
      else {
        lVar18 = 0;
      }
      buffOutSize = 0xffffffffffffffb9;
      if (lVar18 != 0) {
        buffOutSize = lVar18 + 1;
      }
    }
    else {
      buffOutSize = 0;
    }
  }
  if (zbuff == ZSTDb_buffered) {
    buffInSize = 0;
    if ((zc->appliedParams).inBufferMode == ZSTD_bm_buffered) {
      buffInSize = uVar25 + uVar26;
    }
  }
  else {
    buffInSize = 0;
  }
  if (params_00->enableLdm == ZSTD_ps_enable) {
    local_48 = uVar26 / (zc->appliedParams).ldmParams.minMatchLength;
  }
  else {
    local_48 = 0;
  }
  cParams = &(zc->appliedParams).cParams;
  forceResetIndex = ZSTDirp_reset;
  if ((loadedDictSize < 0x20000000) &&
     ((ulong)((long)(zc->blockState).matchState.window.nextSrc -
             (long)(zc->blockState).matchState.window.base) < 0xdf000001)) {
    forceResetIndex = (ZSTD_indexResetPolicy_e)(zc->initialized == 0);
  }
  __size = ZSTD_estimateCCtxSize_usingCCtxParams_internal
                     (cParams,params_00,(uint)(zc->staticSize != 0),
                      (zc->appliedParams).useRowMatchFinder,buffInSize,buffOutSize,pledgedSrcSize,
                      iVar12,maxBlockSize);
  if (0xffffffffffffff88 < __size) {
    return __size;
  }
  sVar19 = zc->staticSize;
  if (sVar19 == 0) {
    piVar1 = &(zc->workspace).workspaceOversizedDuration;
    *piVar1 = *piVar1 + 1;
  }
  pvVar14 = (zc->workspace).workspace;
  if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < __size * 3) {
    bVar9 = false;
  }
  else {
    bVar9 = 0x80 < (zc->workspace).workspaceOversizedDuration;
  }
  ws = &zc->workspace;
  bVar30 = (ulong)((long)(zc->workspace).workspaceEnd - (long)pvVar14) < __size;
  bVar10 = (bool)(bVar30 | bVar9);
  bVar31 = (bool)(bVar10 ^ 1);
  sVar27 = 0xffffffffffffffc0;
  if (!(bool)(bVar30 | bVar9)) {
    sVar27 = __size;
  }
  if ((sVar19 == 0) && (bVar10)) {
    p_Var5 = (zc->customMem).customFree;
    pvVar15 = (zc->customMem).opaque;
    (zc->workspace).initOnceStart = (void *)0x0;
    (zc->workspace).allocFailed = '\0';
    *(undefined3 *)&(zc->workspace).field_0x39 = 0;
    (zc->workspace).workspaceOversizedDuration = 0;
    (zc->workspace).tableValidEnd = (void *)0x0;
    (zc->workspace).allocStart = (void *)0x0;
    (zc->workspace).objectEnd = (void *)0x0;
    (zc->workspace).tableEnd = (void *)0x0;
    ws->workspace = (void *)0x0;
    ws->workspaceEnd = (void *)0x0;
    (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
    (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
    if (pvVar14 != (void *)0x0) {
      if (p_Var5 == (ZSTD_freeFunction)0x0) {
        free(pvVar14);
      }
      else {
        (*p_Var5)(pvVar15,pvVar14);
      }
    }
    p_Var6 = (zc->customMem).customAlloc;
    if (p_Var6 == (ZSTD_allocFunction)0x0) {
      pvVar14 = malloc(__size);
    }
    else {
      pvVar14 = (*p_Var6)((zc->customMem).opaque,__size);
    }
    if (pvVar14 == (void *)0x0) {
      sVar27 = 0xffffffffffffffc0;
    }
    else {
      if (((ulong)pvVar14 & 7) != 0) {
        __assert_fail("((size_t)start & (sizeof(void*)-1)) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x4330,
                      "void ZSTD_cwksp_init(ZSTD_cwksp *, void *, size_t, ZSTD_cwksp_static_alloc_e)"
                     );
      }
      (zc->workspace).workspace = pvVar14;
      (zc->workspace).workspaceEnd = (void *)((long)pvVar14 + __size);
      (zc->workspace).objectEnd = pvVar14;
      (zc->workspace).tableValidEnd = pvVar14;
      pvVar15 = (void *)((ulong)((long)pvVar14 + __size) & 0xffffffffffffffc0);
      (zc->workspace).initOnceStart = pvVar15;
      (zc->workspace).phase = ZSTD_cwksp_alloc_objects;
      (zc->workspace).isStatic = ZSTD_cwksp_dynamic_alloc;
      (zc->workspace).tableEnd = pvVar14;
      (zc->workspace).allocStart = pvVar15;
      (zc->workspace).allocFailed = '\0';
      ZSTD_cwksp_assert_internal_consistency(ws);
      (zc->workspace).workspaceOversizedDuration = 0;
      ZSTD_cwksp_assert_internal_consistency(ws);
      sVar27 = __size;
    }
    forceResetIndex = ZSTDirp_reset;
    if (pvVar14 == (void *)0x0) {
      bVar31 = false;
    }
    else {
      if ((ulong)((long)(zc->workspace).allocStart - (long)(zc->workspace).tableEnd) < 0x2c00) {
        __assert_fail("ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x5905,
                      "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
                     );
      }
      pZVar16 = (ZSTD_compressedBlockState_t *)(zc->workspace).objectEnd;
      if (((ulong)pZVar16 & 7) != 0) {
        __assert_fail("(size_t)alloc % ZSTD_ALIGNOF(void*) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x429d,"void *ZSTD_cwksp_reserve_object(ZSTD_cwksp *, size_t)");
      }
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (((zc->workspace).phase == ZSTD_cwksp_alloc_objects) &&
         (pZVar2 = pZVar16 + 1,
         pZVar2 <= (ZSTD_compressedBlockState_t *)(zc->workspace).workspaceEnd)) {
        (zc->workspace).objectEnd = pZVar2;
        (zc->workspace).tableEnd = pZVar2;
        (zc->workspace).tableValidEnd = pZVar2;
      }
      else {
        (zc->workspace).allocFailed = '\x01';
        pZVar16 = (ZSTD_compressedBlockState_t *)0x0;
      }
      (zc->blockState).prevCBlock = pZVar16;
      if (pZVar16 != (ZSTD_compressedBlockState_t *)0x0) {
        pZVar16 = (ZSTD_compressedBlockState_t *)ZSTD_cwksp_reserve_object(ws,0x1600);
        (zc->blockState).nextCBlock = pZVar16;
        if (pZVar16 != (ZSTD_compressedBlockState_t *)0x0) {
          pUVar17 = (U32 *)ZSTD_cwksp_reserve_object(ws,0x22d8);
          zc->entropyWorkspace = pUVar17;
          bVar31 = pUVar17 != (U32 *)0x0;
          if (!bVar31) {
            sVar27 = 0xffffffffffffffc0;
          }
          goto LAB_001ada16;
        }
      }
      bVar31 = false;
      sVar27 = 0xffffffffffffffc0;
    }
  }
LAB_001ada16:
  if (!bVar31) {
    return sVar27;
  }
  (zc->workspace).tableEnd = (zc->workspace).objectEnd;
  (zc->workspace).allocStart = (void *)((ulong)(zc->workspace).workspaceEnd & 0xffffffffffffffc0);
  (zc->workspace).allocFailed = '\0';
  if (ZSTD_cwksp_alloc_aligned_init_once < (zc->workspace).phase) {
    (zc->workspace).phase = ZSTD_cwksp_alloc_aligned_init_once;
  }
  ZSTD_cwksp_assert_internal_consistency(ws);
  uVar34 = cParams->windowLog;
  uVar35 = cParams->chainLog;
  uVar36 = (zc->appliedParams).cParams.hashLog;
  uVar38 = (zc->appliedParams).cParams.searchLog;
  uVar32 = (zc->appliedParams).cParams.minMatch;
  uVar33 = (zc->appliedParams).cParams.targetLength;
  ZVar11 = (zc->appliedParams).cParams.strategy;
  (zc->blockState).matchState.cParams.searchLog = (zc->appliedParams).cParams.searchLog;
  (zc->blockState).matchState.cParams.minMatch = uVar32;
  (zc->blockState).matchState.cParams.targetLength = uVar33;
  (zc->blockState).matchState.cParams.strategy = ZVar11;
  (zc->blockState).matchState.cParams.windowLog = uVar34;
  (zc->blockState).matchState.cParams.chainLog = uVar35;
  (zc->blockState).matchState.cParams.hashLog = uVar36;
  (zc->blockState).matchState.cParams.searchLog = uVar38;
  (zc->blockState).matchState.prefetchCDictTables =
       (uint)((zc->appliedParams).prefetchCDictTables == ZSTD_ps_enable);
  zc->pledgedSrcSizePlusOne = pledgedSrcSize + 1;
  zc->consumedSrcSize = 0;
  zc->producedCSize = 0;
  if (pledgedSrcSize + 1 == 0) {
    (zc->appliedParams).fParams.contentSizeFlag = 0;
  }
  zc->blockSize = uVar26;
  (zc->xxhState).total_len = 0;
  (zc->xxhState).v[0] = 0;
  (zc->xxhState).v[1] = 0;
  (zc->xxhState).v[2] = 0;
  *(undefined1 (*) [16])((zc->xxhState).v + 3) = (undefined1  [16])0x0;
  (zc->xxhState).mem64[1] = 0;
  (zc->xxhState).mem64[2] = 0;
  *(undefined1 (*) [16])((zc->xxhState).mem64 + 3) = (undefined1  [16])0x0;
  lVar18 = 0;
  (zc->xxhState).reserved64 = 0;
  (zc->xxhState).v[0] = 0x60ea27eeadc0b5d6;
  (zc->xxhState).v[1] = 0xc2b2ae3d27d4eb4f;
  (zc->xxhState).v[2] = 0;
  (zc->xxhState).v[3] = 0x61c8864e7a143579;
  zc->stage = ZSTDcs_init;
  zc->dictID = 0;
  zc->dictContentSize = 0;
  pZVar16 = (zc->blockState).prevCBlock;
  do {
    *(undefined4 *)((long)pZVar16->rep + lVar18) = *(undefined4 *)((long)repStartValue + lVar18);
    lVar18 = lVar18 + 4;
  } while (lVar18 != 0xc);
  (pZVar16->entropy).huf.repeatMode = HUF_repeat_none;
  (pZVar16->entropy).fse.offcode_repeatMode = FSE_repeat_none;
  (pZVar16->entropy).fse.matchlength_repeatMode = FSE_repeat_none;
  (pZVar16->entropy).fse.litlength_repeatMode = FSE_repeat_none;
  sVar19 = ZSTD_reset_matchState
                     (&(zc->blockState).matchState,ws,cParams,(zc->appliedParams).useRowMatchFinder,
                      crp,forceResetIndex,ZSTD_resetTarget_CCtx);
  if (0xffffffffffffff88 < sVar19) {
    return sVar19;
  }
  psVar20 = (seqDef *)ZSTD_cwksp_reserve_aligned(ws,uVar13 * 8);
  (zc->seqStore).sequencesStart = psVar20;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    sVar19 = 8L << ((byte)(zc->appliedParams).ldmParams.hashLog & 0x3f);
    __s = (ldmEntry_t *)ZSTD_cwksp_reserve_aligned(ws,sVar19);
    (zc->ldmState).hashTable = __s;
    memset(__s,0,sVar19);
    prVar21 = (rawSeq *)ZSTD_cwksp_reserve_aligned(ws,local_48 * 0xc);
    zc->ldmSequences = prVar21;
    zc->maxNbLdmSequences = local_48;
    (zc->ldmState).window.nextSrc = (BYTE *)0x0;
    (zc->ldmState).window.base = (BYTE *)0x0;
    (zc->ldmState).window.dictBase = (BYTE *)0x0;
    (zc->ldmState).window.dictLimit = 0;
    (zc->ldmState).window.lowLimit = 0;
    *(undefined8 *)&(zc->ldmState).window.nbOverflowCorrections = 0;
    (zc->ldmState).window.base = " ";
    (zc->ldmState).window.dictBase = " ";
    (zc->ldmState).window.dictLimit = 2;
    (zc->ldmState).window.lowLimit = 2;
    (zc->ldmState).window.nextSrc = (BYTE *)"BC7 709 Luma:            ";
    (zc->ldmState).window.nbOverflowCorrections = 0;
    (zc->ldmState).loadedDictEnd = 0;
  }
  if ((zc->appliedParams).useSequenceProducer != 0) {
    sVar19 = uVar26 / 3 + 1;
    (zc->externalMatchCtx).seqBufferCapacity = sVar19;
    pZVar22 = (ZSTD_Sequence *)ZSTD_cwksp_reserve_aligned(ws,sVar19 * 0x10);
    (zc->externalMatchCtx).seqBuffer = pZVar22;
  }
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001ae44d;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001add6e:
    bVar9 = false;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001add52:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001add6e;
    }
    pvVar14 = (zc->workspace).workspaceEnd;
    pvVar15 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar15;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar14 & 0xffffffffffffffc0);
    uVar25 = (ulong)(-(int)pvVar15 & 0x3f);
    pvVar15 = (void *)((long)pvVar15 + uVar25);
    bVar9 = true;
    if (pvVar15 <= pvVar14) {
      (zc->workspace).objectEnd = pvVar15;
      (zc->workspace).tableEnd = pvVar15;
      if (uVar25 != 0) {
        (zc->workspace).tableValidEnd = pvVar15;
      }
      goto LAB_001add52;
    }
  }
  if (uVar26 == 0xffffffffffffffe0 || bVar9) {
    pBVar29 = (BYTE *)0x0;
  }
  else {
    pBVar29 = (BYTE *)((long)(zc->workspace).allocStart + (-0x20 - uVar26));
    pBVar8 = (BYTE *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar29 < pBVar8) goto LAB_001ae4aa;
    if (pBVar29 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar29;
    }
    (zc->workspace).allocStart = pBVar29;
  }
  (zc->seqStore).litStart = pBVar29;
  (zc->seqStore).maxNbLit = uVar26;
  zc->bufferedPolicy = zbuff;
  zc->inBuffSize = buffInSize;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001ae44d;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001ade71:
    bVar9 = false;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001ade54:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001ade71;
    }
    pvVar14 = (zc->workspace).workspaceEnd;
    pvVar15 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar15;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar14 & 0xffffffffffffffc0);
    uVar25 = (ulong)(-(int)pvVar15 & 0x3f);
    pvVar15 = (void *)((long)pvVar15 + uVar25);
    bVar9 = true;
    if (pvVar15 <= pvVar14) {
      (zc->workspace).objectEnd = pvVar15;
      (zc->workspace).tableEnd = pvVar15;
      if (uVar25 != 0) {
        (zc->workspace).tableValidEnd = pvVar15;
      }
      goto LAB_001ade54;
    }
  }
  if (buffInSize == 0 || bVar9) {
    pcVar28 = (char *)0x0;
  }
  else {
    pcVar28 = (char *)((long)(zc->workspace).allocStart - buffInSize);
    pcVar7 = (char *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pcVar28 < pcVar7) goto LAB_001ae4aa;
    if (pcVar28 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pcVar28;
    }
    (zc->workspace).allocStart = pcVar28;
  }
  zc->inBuff = pcVar28;
  zc->outBuffSize = buffOutSize;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001ae44d;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001adf4d:
    bVar9 = false;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001adf35:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001adf4d;
    }
    pvVar14 = (zc->workspace).workspaceEnd;
    pvVar15 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar15;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar14 & 0xffffffffffffffc0);
    uVar25 = (ulong)(-(int)pvVar15 & 0x3f);
    pvVar15 = (void *)((long)pvVar15 + uVar25);
    bVar9 = true;
    if (pvVar15 <= pvVar14) {
      (zc->workspace).objectEnd = pvVar15;
      (zc->workspace).tableEnd = pvVar15;
      if (uVar25 != 0) {
        (zc->workspace).tableValidEnd = pvVar15;
      }
      goto LAB_001adf35;
    }
  }
  if (buffOutSize == 0 || bVar9) {
    pcVar28 = (char *)0x0;
  }
  else {
    pcVar28 = (char *)((long)(zc->workspace).allocStart - buffOutSize);
    pcVar7 = (char *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pcVar28 < pcVar7) goto LAB_001ae4aa;
    if (pcVar28 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pcVar28;
    }
    (zc->workspace).allocStart = pcVar28;
  }
  zc->outBuff = pcVar28;
  if ((zc->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    ZVar4 = (zc->workspace).phase;
    __n = 1L << ((char)(zc->appliedParams).ldmParams.hashLog -
                 (char)(zc->appliedParams).ldmParams.bucketSizeLog & 0x3fU);
    if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001ae44d;
    if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001ae05e:
      pBVar29 = (BYTE *)((long)(zc->workspace).allocStart - __n);
      pBVar8 = (BYTE *)(zc->workspace).tableEnd;
      ZSTD_cwksp_assert_internal_consistency(ws);
      if (pBVar29 < pBVar8) goto LAB_001ae4aa;
      if (pBVar29 < (zc->workspace).tableValidEnd) {
        (zc->workspace).tableValidEnd = pBVar29;
      }
      (zc->workspace).allocStart = pBVar29;
    }
    else {
      if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001ae04b:
        (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
        ZSTD_cwksp_assert_internal_consistency(ws);
        goto LAB_001ae05e;
      }
      pvVar14 = (zc->workspace).workspaceEnd;
      pvVar15 = (zc->workspace).objectEnd;
      (zc->workspace).tableValidEnd = pvVar15;
      (zc->workspace).initOnceStart = (void *)((ulong)pvVar14 & 0xffffffffffffffc0);
      uVar25 = (ulong)(-(int)pvVar15 & 0x3f);
      pvVar15 = (void *)((long)pvVar15 + uVar25);
      if (pvVar15 <= pvVar14) {
        (zc->workspace).objectEnd = pvVar15;
        (zc->workspace).tableEnd = pvVar15;
        if (uVar25 != 0) {
          (zc->workspace).tableValidEnd = pvVar15;
        }
        goto LAB_001ae04b;
      }
      pBVar29 = (BYTE *)0x0;
    }
    (zc->ldmState).bucketOffsets = pBVar29;
    memset(pBVar29,0,__n);
  }
  if ((zc->stage == ZSTDcs_init) && (params_00->enableLdm != ZSTD_ps_enable)) {
    (zc->externSeqStore).posInSequence = 0;
    (zc->externSeqStore).size = 0;
    (zc->externSeqStore).seq = (rawSeq *)0x0;
    (zc->externSeqStore).pos = 0;
    (zc->externSeqStore).capacity = 0;
  }
  (zc->seqStore).maxNbSeq = uVar13;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001ae44d;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001ae166:
    bVar9 = false;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001ae153:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001ae166;
    }
    pvVar14 = (zc->workspace).workspaceEnd;
    pvVar15 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar15;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar14 & 0xffffffffffffffc0);
    uVar25 = (ulong)(-(int)pvVar15 & 0x3f);
    pvVar15 = (void *)((long)pvVar15 + uVar25);
    bVar9 = true;
    if (pvVar15 <= pvVar14) {
      (zc->workspace).objectEnd = pvVar15;
      (zc->workspace).tableEnd = pvVar15;
      if (uVar25 != 0) {
        (zc->workspace).tableValidEnd = pvVar15;
      }
      goto LAB_001ae153;
    }
  }
  if (uVar26 < uVar23 || bVar9) {
    pBVar29 = (BYTE *)0x0;
  }
  else {
    pBVar29 = (BYTE *)((long)(zc->workspace).allocStart - uVar13);
    pBVar8 = (BYTE *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar29 < pBVar8) goto LAB_001ae4aa;
    if (pBVar29 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar29;
    }
    (zc->workspace).allocStart = pBVar29;
  }
  (zc->seqStore).llCode = pBVar29;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) goto LAB_001ae44d;
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001ae233:
    bVar9 = false;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001ae220:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001ae233;
    }
    pvVar14 = (zc->workspace).workspaceEnd;
    pvVar15 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar15;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar14 & 0xffffffffffffffc0);
    uVar25 = (ulong)(-(int)pvVar15 & 0x3f);
    pvVar15 = (void *)((long)pvVar15 + uVar25);
    bVar9 = true;
    if (pvVar15 <= pvVar14) {
      (zc->workspace).objectEnd = pvVar15;
      (zc->workspace).tableEnd = pvVar15;
      if (uVar25 != 0) {
        (zc->workspace).tableValidEnd = pvVar15;
      }
      goto LAB_001ae220;
    }
  }
  if (uVar26 < uVar23 || bVar9) {
    pBVar29 = (BYTE *)0x0;
  }
  else {
    pBVar29 = (BYTE *)((long)(zc->workspace).allocStart - uVar13);
    pBVar8 = (BYTE *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar29 < pBVar8) goto LAB_001ae4aa;
    if (pBVar29 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar29;
    }
    (zc->workspace).allocStart = pBVar29;
  }
  (zc->seqStore).mlCode = pBVar29;
  ZVar4 = (zc->workspace).phase;
  if (ZSTD_cwksp_alloc_buffers < ZVar4) {
LAB_001ae44d:
    __assert_fail("phase >= ws->phase",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x41e6,
                  "size_t ZSTD_cwksp_internal_advance_phase(ZSTD_cwksp *, ZSTD_cwksp_alloc_phase_e)"
                 );
  }
  if (ZVar4 == ZSTD_cwksp_alloc_buffers) {
LAB_001ae300:
    bVar9 = false;
  }
  else {
    if (ZVar4 != ZSTD_cwksp_alloc_objects) {
LAB_001ae2ed:
      (zc->workspace).phase = ZSTD_cwksp_alloc_buffers;
      ZSTD_cwksp_assert_internal_consistency(ws);
      goto LAB_001ae300;
    }
    pvVar14 = (zc->workspace).workspaceEnd;
    pvVar15 = (zc->workspace).objectEnd;
    (zc->workspace).tableValidEnd = pvVar15;
    (zc->workspace).initOnceStart = (void *)((ulong)pvVar14 & 0xffffffffffffffc0);
    uVar25 = (ulong)(-(int)pvVar15 & 0x3f);
    pvVar15 = (void *)((long)pvVar15 + uVar25);
    bVar9 = true;
    if (pvVar15 <= pvVar14) {
      (zc->workspace).objectEnd = pvVar15;
      (zc->workspace).tableEnd = pvVar15;
      if (uVar25 != 0) {
        (zc->workspace).tableValidEnd = pvVar15;
      }
      goto LAB_001ae2ed;
    }
  }
  if (uVar26 < uVar23 || bVar9) {
    pBVar29 = (BYTE *)0x0;
  }
  else {
    pBVar29 = (BYTE *)((long)(zc->workspace).allocStart - uVar13);
    pBVar8 = (BYTE *)(zc->workspace).tableEnd;
    ZSTD_cwksp_assert_internal_consistency(ws);
    if (pBVar29 < pBVar8) {
LAB_001ae4aa:
      __assert_fail("alloc >= bottom",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x41cf,
                    "void *ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp *, const size_t)");
    }
    if (pBVar29 < (zc->workspace).tableValidEnd) {
      (zc->workspace).tableValidEnd = pBVar29;
    }
    (zc->workspace).allocStart = pBVar29;
  }
  (zc->seqStore).ofCode = pBVar29;
  uVar25 = ((long)(zc->workspace).tableEnd + (long)(zc->workspace).workspaceEnd) -
           ((long)(zc->workspace).workspace + (long)(zc->workspace).allocStart);
  if ((__size - 0x80 <= uVar25) && (uVar25 <= __size)) {
    zc->initialized = 1;
    return 0;
  }
  __assert_fail("ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5963,
                "size_t ZSTD_resetCCtx_internal(ZSTD_CCtx *, const ZSTD_CCtx_params *, const U64, const size_t, const ZSTD_compResetPolicy_e, const ZSTD_buffered_policy_e)"
               );
}

Assistant:

static size_t ZSTD_resetCCtx_internal(ZSTD_CCtx* zc,
                                      ZSTD_CCtx_params const* params,
                                      U64 const pledgedSrcSize,
                                      size_t const loadedDictSize,
                                      ZSTD_compResetPolicy_e const crp,
                                      ZSTD_buffered_policy_e const zbuff)
{
    ZSTD_cwksp* const ws = &zc->workspace;
    DEBUGLOG(4, "ZSTD_resetCCtx_internal: pledgedSrcSize=%u, wlog=%u, useRowMatchFinder=%d useBlockSplitter=%d",
                (U32)pledgedSrcSize, params->cParams.windowLog, (int)params->useRowMatchFinder, (int)params->useBlockSplitter);
    assert(!ZSTD_isError(ZSTD_checkCParams(params->cParams)));

    zc->isFirstBlock = 1;

    /* Set applied params early so we can modify them for LDM,
     * and point params at the applied params.
     */
    zc->appliedParams = *params;
    params = &zc->appliedParams;

    assert(params->useRowMatchFinder != ZSTD_ps_auto);
    assert(params->useBlockSplitter != ZSTD_ps_auto);
    assert(params->ldmParams.enableLdm != ZSTD_ps_auto);
    assert(params->maxBlockSize != 0);
    if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
        /* Adjust long distance matching parameters */
        ZSTD_ldm_adjustParameters(&zc->appliedParams.ldmParams, &params->cParams);
        assert(params->ldmParams.hashLog >= params->ldmParams.bucketSizeLog);
        assert(params->ldmParams.hashRateLog < 32);
    }

    {   size_t const windowSize = MAX(1, (size_t)MIN(((U64)1 << params->cParams.windowLog), pledgedSrcSize));
        size_t const blockSize = MIN(params->maxBlockSize, windowSize);
        size_t const maxNbSeq = ZSTD_maxNbSeq(blockSize, params->cParams.minMatch, params->useSequenceProducer);
        size_t const buffOutSize = (zbuff == ZSTDb_buffered && params->outBufferMode == ZSTD_bm_buffered)
                ? ZSTD_compressBound(blockSize) + 1
                : 0;
        size_t const buffInSize = (zbuff == ZSTDb_buffered && params->inBufferMode == ZSTD_bm_buffered)
                ? windowSize + blockSize
                : 0;
        size_t const maxNbLdmSeq = ZSTD_ldm_getMaxNbSeq(params->ldmParams, blockSize);

        int const indexTooClose = ZSTD_indexTooCloseToMax(zc->blockState.matchState.window);
        int const dictTooBig = ZSTD_dictTooBig(loadedDictSize);
        ZSTD_indexResetPolicy_e needsIndexReset =
            (indexTooClose || dictTooBig || !zc->initialized) ? ZSTDirp_reset : ZSTDirp_continue;

        size_t const neededSpace =
            ZSTD_estimateCCtxSize_usingCCtxParams_internal(
                &params->cParams, &params->ldmParams, zc->staticSize != 0, params->useRowMatchFinder,
                buffInSize, buffOutSize, pledgedSrcSize, params->useSequenceProducer, params->maxBlockSize);
        int resizeWorkspace;

        FORWARD_IF_ERROR(neededSpace, "cctx size estimate failed!");

        if (!zc->staticSize) ZSTD_cwksp_bump_oversized_duration(ws, 0);

        {   /* Check if workspace is large enough, alloc a new one if needed */
            int const workspaceTooSmall = ZSTD_cwksp_sizeof(ws) < neededSpace;
            int const workspaceWasteful = ZSTD_cwksp_check_wasteful(ws, neededSpace);
            resizeWorkspace = workspaceTooSmall || workspaceWasteful;
            DEBUGLOG(4, "Need %zu B workspace", neededSpace);
            DEBUGLOG(4, "windowSize: %zu - blockSize: %zu", windowSize, blockSize);

            if (resizeWorkspace) {
                DEBUGLOG(4, "Resize workspaceSize from %zuKB to %zuKB",
                            ZSTD_cwksp_sizeof(ws) >> 10,
                            neededSpace >> 10);

                RETURN_ERROR_IF(zc->staticSize, memory_allocation, "static cctx : no resize");

                needsIndexReset = ZSTDirp_reset;

                ZSTD_cwksp_free(ws, zc->customMem);
                FORWARD_IF_ERROR(ZSTD_cwksp_create(ws, neededSpace, zc->customMem), "");

                DEBUGLOG(5, "reserving object space");
                /* Statically sized space.
                 * entropyWorkspace never moves,
                 * though prev/next block swap places */
                assert(ZSTD_cwksp_check_available(ws, 2 * sizeof(ZSTD_compressedBlockState_t)));
                zc->blockState.prevCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.prevCBlock == NULL, memory_allocation, "couldn't allocate prevCBlock");
                zc->blockState.nextCBlock = (ZSTD_compressedBlockState_t*) ZSTD_cwksp_reserve_object(ws, sizeof(ZSTD_compressedBlockState_t));
                RETURN_ERROR_IF(zc->blockState.nextCBlock == NULL, memory_allocation, "couldn't allocate nextCBlock");
                zc->entropyWorkspace = (U32*) ZSTD_cwksp_reserve_object(ws, ENTROPY_WORKSPACE_SIZE);
                RETURN_ERROR_IF(zc->entropyWorkspace == NULL, memory_allocation, "couldn't allocate entropyWorkspace");
        }   }

        ZSTD_cwksp_clear(ws);

        /* init params */
        zc->blockState.matchState.cParams = params->cParams;
        zc->blockState.matchState.prefetchCDictTables = params->prefetchCDictTables == ZSTD_ps_enable;
        zc->pledgedSrcSizePlusOne = pledgedSrcSize+1;
        zc->consumedSrcSize = 0;
        zc->producedCSize = 0;
        if (pledgedSrcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            zc->appliedParams.fParams.contentSizeFlag = 0;
        DEBUGLOG(4, "pledged content size : %u ; flag : %u",
            (unsigned)pledgedSrcSize, zc->appliedParams.fParams.contentSizeFlag);
        zc->blockSize = blockSize;

        XXH64_reset(&zc->xxhState, 0);
        zc->stage = ZSTDcs_init;
        zc->dictID = 0;
        zc->dictContentSize = 0;

        ZSTD_reset_compressedBlockState(zc->blockState.prevCBlock);

        FORWARD_IF_ERROR(ZSTD_reset_matchState(
                &zc->blockState.matchState,
                ws,
                &params->cParams,
                params->useRowMatchFinder,
                crp,
                needsIndexReset,
                ZSTD_resetTarget_CCtx), "");

        zc->seqStore.sequencesStart = (seqDef*)ZSTD_cwksp_reserve_aligned(ws, maxNbSeq * sizeof(seqDef));

        /* ldm hash table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const ldmHSize = ((size_t)1) << params->ldmParams.hashLog;
            zc->ldmState.hashTable = (ldmEntry_t*)ZSTD_cwksp_reserve_aligned(ws, ldmHSize * sizeof(ldmEntry_t));
            ZSTD_memset(zc->ldmState.hashTable, 0, ldmHSize * sizeof(ldmEntry_t));
            zc->ldmSequences = (rawSeq*)ZSTD_cwksp_reserve_aligned(ws, maxNbLdmSeq * sizeof(rawSeq));
            zc->maxNbLdmSequences = maxNbLdmSeq;

            ZSTD_window_init(&zc->ldmState.window);
            zc->ldmState.loadedDictEnd = 0;
        }

        /* reserve space for block-level external sequences */
        if (params->useSequenceProducer) {
            size_t const maxNbExternalSeq = ZSTD_sequenceBound(blockSize);
            zc->externalMatchCtx.seqBufferCapacity = maxNbExternalSeq;
            zc->externalMatchCtx.seqBuffer =
                (ZSTD_Sequence*)ZSTD_cwksp_reserve_aligned(ws, maxNbExternalSeq * sizeof(ZSTD_Sequence));
        }

        /* buffers */

        /* ZSTD_wildcopy() is used to copy into the literals buffer,
         * so we have to oversize the buffer by WILDCOPY_OVERLENGTH bytes.
         */
        zc->seqStore.litStart = ZSTD_cwksp_reserve_buffer(ws, blockSize + WILDCOPY_OVERLENGTH);
        zc->seqStore.maxNbLit = blockSize;

        zc->bufferedPolicy = zbuff;
        zc->inBuffSize = buffInSize;
        zc->inBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffInSize);
        zc->outBuffSize = buffOutSize;
        zc->outBuff = (char*)ZSTD_cwksp_reserve_buffer(ws, buffOutSize);

        /* ldm bucketOffsets table */
        if (params->ldmParams.enableLdm == ZSTD_ps_enable) {
            /* TODO: avoid memset? */
            size_t const numBuckets =
                  ((size_t)1) << (params->ldmParams.hashLog -
                                  params->ldmParams.bucketSizeLog);
            zc->ldmState.bucketOffsets = ZSTD_cwksp_reserve_buffer(ws, numBuckets);
            ZSTD_memset(zc->ldmState.bucketOffsets, 0, numBuckets);
        }

        /* sequences storage */
        ZSTD_referenceExternalSequences(zc, NULL, 0);
        zc->seqStore.maxNbSeq = maxNbSeq;
        zc->seqStore.llCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.mlCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));
        zc->seqStore.ofCode = ZSTD_cwksp_reserve_buffer(ws, maxNbSeq * sizeof(BYTE));

        DEBUGLOG(3, "wksp: finished allocating, %zd bytes remain available", ZSTD_cwksp_available_space(ws));
        assert(ZSTD_cwksp_estimated_space_within_bounds(ws, neededSpace));

        zc->initialized = 1;

        return 0;
    }
}